

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_sendfile_emul(uv_fs_t *req)

{
  int __fd;
  int __fd_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  bool bVar6;
  undefined1 local_2068 [8];
  char buf [8192];
  int out_fd;
  int in_fd;
  ssize_t n;
  size_t len;
  size_t buflen;
  ssize_t nwritten;
  ssize_t nread;
  ssize_t nsent;
  off_t_conflict offset;
  int local_18;
  int use_pread;
  pollfd pfd;
  uv_fs_t *req_local;
  
  uVar1 = req->bufsml[0].len;
  __fd = req->flags;
  __fd_00 = req->file;
  nsent = req->off;
  bVar2 = true;
  nread = 0;
  pfd = (pollfd)req;
LAB_00214576:
  do {
    if (uVar1 <= (ulong)nread) {
LAB_00214796:
      if (nread != -1) {
        *(ssize_t *)((long)pfd + 0x130) = nsent;
      }
      return nread;
    }
    len = uVar1 - nread;
    if (0x2000 < len) {
      len = 0x2000;
    }
    do {
      if (bVar2) {
        nwritten = pread64(__fd,local_2068,len,nsent);
      }
      else {
        nwritten = read(__fd,local_2068,len);
      }
      bVar6 = false;
      if (nwritten == -1) {
        piVar4 = __errno_location();
        bVar6 = *piVar4 == 4;
      }
    } while (bVar6);
    if (nwritten == 0) goto LAB_00214796;
    if (nwritten == -1) {
      if (((!bVar2) || (nread != 0)) ||
         ((piVar4 = __errno_location(), *piVar4 != 5 &&
          (piVar4 = __errno_location(), *piVar4 != 0x1d)))) {
        if (nread == 0) {
          nread = -1;
        }
        goto LAB_00214796;
      }
      bVar2 = false;
      goto LAB_00214576;
    }
    buflen = 0;
    while ((long)buflen < nwritten) {
      do {
        sVar5 = write(__fd_00,local_2068 + buflen,nwritten - buflen);
        bVar6 = false;
        if (sVar5 == -1) {
          piVar4 = __errno_location();
          bVar6 = *piVar4 == 4;
        }
      } while (bVar6);
      if (sVar5 == -1) {
        piVar4 = __errno_location();
        if ((*piVar4 != 0xb) && (piVar4 = __errno_location(), *piVar4 != 0xb)) {
          nread = -1;
          goto LAB_00214796;
        }
        use_pread._0_2_ = 4;
        use_pread._2_2_ = 0;
        local_18 = __fd_00;
        do {
          iVar3 = poll((pollfd *)&stack0xffffffffffffffe8,1,-1);
          bVar6 = false;
          if (iVar3 == -1) {
            piVar4 = __errno_location();
            bVar6 = *piVar4 == 4;
          }
        } while (bVar6);
        if ((iVar3 == -1) || ((use_pread._2_2_ & 0xfffb) != 0)) {
          piVar4 = __errno_location();
          *piVar4 = 5;
          nread = -1;
          goto LAB_00214796;
        }
      }
      else {
        buflen = sVar5 + buflen;
      }
    }
    nsent = nwritten + nsent;
    nread = nwritten + nread;
  } while( true );
}

Assistant:

static ssize_t uv__fs_sendfile_emul(uv_fs_t* req) {
  struct pollfd pfd;
  int use_pread;
  off_t offset;
  ssize_t nsent;
  ssize_t nread;
  ssize_t nwritten;
  size_t buflen;
  size_t len;
  ssize_t n;
  int in_fd;
  int out_fd;
  char buf[8192];

  len = req->bufsml[0].len;
  in_fd = req->flags;
  out_fd = req->file;
  offset = req->off;
  use_pread = 1;

  /* Here are the rules regarding errors:
   *
   * 1. Read errors are reported only if nsent==0, otherwise we return nsent.
   *    The user needs to know that some data has already been sent, to stop
   *    them from sending it twice.
   *
   * 2. Write errors are always reported. Write errors are bad because they
   *    mean data loss: we've read data but now we can't write it out.
   *
   * We try to use pread() and fall back to regular read() if the source fd
   * doesn't support positional reads, for example when it's a pipe fd.
   *
   * If we get EAGAIN when writing to the target fd, we poll() on it until
   * it becomes writable again.
   *
   * FIXME: If we get a write error when use_pread==1, it should be safe to
   *        return the number of sent bytes instead of an error because pread()
   *        is, in theory, idempotent. However, special files in /dev or /proc
   *        may support pread() but not necessarily return the same data on
   *        successive reads.
   *
   * FIXME: There is no way now to signal that we managed to send *some* data
   *        before a write error.
   */
  for (nsent = 0; (size_t) nsent < len; ) {
    buflen = len - nsent;

    if (buflen > sizeof(buf))
      buflen = sizeof(buf);

    do
      if (use_pread)
        nread = pread(in_fd, buf, buflen, offset);
      else
        nread = read(in_fd, buf, buflen);
    while (nread == -1 && errno == EINTR);

    if (nread == 0)
      goto out;

    if (nread == -1) {
      if (use_pread && nsent == 0 && (errno == EIO || errno == ESPIPE)) {
        use_pread = 0;
        continue;
      }

      if (nsent == 0)
        nsent = -1;

      goto out;
    }

    for (nwritten = 0; nwritten < nread; ) {
      do
        n = write(out_fd, buf + nwritten, nread - nwritten);
      while (n == -1 && errno == EINTR);

      if (n != -1) {
        nwritten += n;
        continue;
      }

      if (errno != EAGAIN && errno != EWOULDBLOCK) {
        nsent = -1;
        goto out;
      }

      pfd.fd = out_fd;
      pfd.events = POLLOUT;
      pfd.revents = 0;

      do
        n = poll(&pfd, 1, -1);
      while (n == -1 && errno == EINTR);

      if (n == -1 || (pfd.revents & ~POLLOUT) != 0) {
        errno = EIO;
        nsent = -1;
        goto out;
      }
    }

    offset += nread;
    nsent += nread;
  }

out:
  if (nsent != -1)
    req->off = offset;

  return nsent;
}